

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfTport.c
# Opt level: O1

void sbfTportFirstDestroyStreamCb(int fd,short events,void *closure)

{
  long lVar1;
  long *plVar2;
  long lVar3;
  undefined8 uVar4;
  sbfPub pub;
  sbfSub sub;
  long lVar5;
  bool bVar6;
  
  lVar3 = *closure;
  sbfLog_log(*(undefined8 *)(lVar3 + 8),0,"first destroy callback for stream %p",
             *(undefined8 *)((long)closure + 8));
  lVar1 = *(long *)(lVar3 + 0x170);
  if (lVar1 != 0) {
    do {
      if (lVar1 == *(long *)((long)closure + 8)) {
        plVar2 = (long *)(lVar1 + 0x20);
        lVar3 = 0;
        do {
          lVar1 = lVar3;
          lVar3 = *plVar2;
          plVar2 = (long *)(lVar3 + 0x50);
        } while (lVar3 != 0);
        do {
          if (lVar1 == 0) {
            sbfMw_enqueueThread(*(undefined8 *)((long)closure + 0x10),(long)closure + 0x18,
                                sbfTportSecondDestroyStreamCb,closure);
            return;
          }
          lVar3 = *(long *)(lVar1 + 0x58);
          if (*(long *)(lVar1 + 0x58) == 0) {
            lVar5 = *(long *)(lVar1 + 0x60);
            lVar3 = lVar1;
            if ((lVar5 == 0) || (*(long *)(lVar5 + 0x50) != lVar1)) {
              do {
                lVar5 = *(long *)(lVar3 + 0x60);
                if (lVar5 == 0) break;
                bVar6 = lVar3 == *(long *)(lVar5 + 0x58);
                lVar3 = lVar5;
              } while (bVar6);
            }
          }
          else {
            do {
              lVar5 = lVar3;
              lVar3 = *(long *)(lVar5 + 0x50);
            } while (*(long *)(lVar5 + 0x50) != 0);
          }
          for (pub = *(sbfPub *)(lVar1 + 8); pub != (sbfPub)0x0; pub = (pub->mEntry).tqe_next) {
            sbfPub_destroy(pub);
          }
          for (sub = *(sbfSub *)(lVar1 + 0x18); lVar1 = lVar5, sub != (sbfSub)0x0;
              sub = (sub->mEntry).tqe_next) {
            sbfSub_destroy(sub);
          }
        } while( true );
      }
      lVar1 = *(long *)(lVar1 + 0x50);
    } while (lVar1 != 0);
  }
  uVar4 = *(undefined8 *)(lVar3 + 8);
  sbfLog_log(uVar4,0,"stream %p has already been destroyed",*(undefined8 *)((long)closure + 8));
  sbfTportSecondDestroyStreamCb((int)uVar4,0,closure);
  return;
}

Assistant:

static void
sbfTportFirstDestroyStreamCb (int fd, short events, void* closure)
{
    sbfTportDestroyStreamClosure* closure0 = closure;
    sbfTportStream                tstream;
    sbfTport                      tport = closure0->mTport;
    sbfTportTopic                 ttopic;
    sbfTportTopic                 ttopic1;
    sbfPub                        pub;
    sbfSub                        sub;

    sbfLog_debug (tport->mLog,
                  "first destroy callback for stream %p",
                  closure0->mTportStream);

    /*
     * Removing pubs or subs may already have disposed of the stream so check
     * if it's still on the transport's list.
     */
    TAILQ_FOREACH (tstream, &tport->mStreams, mEntry)
    {
        if (tstream == closure0->mTportStream)
            break;
    }

    if (tstream == NULL)
    {
        sbfLog_debug (tport->mLog,
                      "stream %p has already been destroyed",
                      closure0->mTportStream);
        sbfTportSecondDestroyStreamCb (fd, events, closure);
        return;
    }

    RB_FOREACH_SAFE (ttopic, sbfTportTopicTreeImpl, &tstream->mTopics, ttopic1)
    {
        TAILQ_FOREACH (pub, &ttopic->mPubs, mEntry)
            sbfPub_destroy (pub);
        TAILQ_FOREACH (sub, &ttopic->mSubs, mEntry)
            sbfSub_destroy (sub);
    }

    /*
     * Queue to wakeup after the publisher and subscriber events (which will
     * have freed and removed the stream).
     */
    sbfMw_enqueueThread (closure0->mThread,
                         &closure0->mEvent,
                         sbfTportSecondDestroyStreamCb,
                         closure0);
}